

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni2name.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeNameTransliterator::handleTransliterate
          (UnicodeNameTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool param_3)

{
  uint code;
  int32_t length;
  UnicodeString *this_00;
  __off_t __length;
  uint uVar1;
  int iVar2;
  int local_f0;
  UErrorCode status;
  char *local_e8;
  int32_t local_dc;
  Replaceable *local_d8;
  ConstChar16Ptr local_d0;
  UTransPosition *local_c8;
  char16_t *local_c0;
  UnicodeString str;
  UnicodeString local_70;
  
  local_d8 = text;
  local_dc = uprv_getMaxCharNameLength_63();
  if ((local_dc != 0) &&
     (local_e8 = (char *)uprv_malloc_63((long)local_dc), local_e8 != (char *)0x0)) {
    uVar1 = offsets->start;
    local_f0 = offsets->limit;
    local_d0.p_ = L"\\N{";
    local_c8 = offsets;
    icu_63::UnicodeString::UnicodeString(&str,'\0',&local_d0,3);
    local_c0 = local_d0.p_;
    for (; (int)uVar1 < local_f0; uVar1 = uVar1 + iVar2) {
      code = (*(local_d8->super_UObject)._vptr_UObject[10])(local_d8,(ulong)uVar1);
      status = U_ZERO_ERROR;
      length = u_charName_63(code,U_EXTENDED_CHAR_NAME,local_e8,local_dc,&status);
      iVar2 = 2 - (uint)(code < 0x10000);
      if ((0 < length) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
        icu_63::UnicodeString::truncate(&str,(char *)0x3,__length);
        icu_63::UnicodeString::UnicodeString(&local_70,local_e8,length,kInvariant);
        this_00 = icu_63::UnicodeString::append(&str,&local_70);
        icu_63::UnicodeString::append(this_00,L'}');
        icu_63::UnicodeString::~UnicodeString(&local_70);
        (*(local_d8->super_UObject)._vptr_UObject[4])
                  (local_d8,(ulong)uVar1,(ulong)(iVar2 + uVar1),&str);
        iVar2 = length + 4;
        local_f0 = length + (code < 0x10000 | 0xfffffffe) + local_f0 + 4;
      }
    }
    local_c8->contextLimit = local_c8->contextLimit + (local_f0 - local_c8->limit);
    local_c8->limit = local_f0;
    local_c8->start = uVar1;
    uprv_free_63(local_e8);
    icu_63::UnicodeString::~UnicodeString(&str);
    return;
  }
  offsets->start = offsets->limit;
  return;
}

Assistant:

void UnicodeNameTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool /*isIncremental*/) const {
    // The failure mode, here and below, is to behave like Any-Null,
    // if either there is no name data (max len == 0) or there is no
    // memory (malloc() => NULL).

    int32_t maxLen = uprv_getMaxCharNameLength();
    if (maxLen == 0) {
        offsets.start = offsets.limit;
        return;
    }

    // Accomodate the longest possible name plus padding
    char* buf = (char*) uprv_malloc(maxLen);
    if (buf == NULL) {
        offsets.start = offsets.limit;
        return;
    }
    
    int32_t cursor = offsets.start;
    int32_t limit = offsets.limit;

    UnicodeString str(FALSE, OPEN_DELIM, OPEN_DELIM_LEN);
    UErrorCode status;
    int32_t len;

    while (cursor < limit) {
        UChar32 c = text.char32At(cursor);
        int32_t clen = U16_LENGTH(c);
        status = U_ZERO_ERROR;
        if ((len = u_charName(c, U_EXTENDED_CHAR_NAME, buf, maxLen, &status)) >0 && !U_FAILURE(status)) {
            str.truncate(OPEN_DELIM_LEN);
            str.append(UnicodeString(buf, len, US_INV)).append(CLOSE_DELIM);
            text.handleReplaceBetween(cursor, cursor+clen, str);
            len += OPEN_DELIM_LEN + 1; // adjust for delimiters
            cursor += len; // advance cursor and adjust for new text
            limit += len-clen; // change in length
        } else {
            cursor += clen;
        }
    }

    offsets.contextLimit += limit - offsets.limit;
    offsets.limit = limit;
    offsets.start = cursor;

    uprv_free(buf);
}